

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats_scan_avx2_256_8.c
# Opt level: O3

parasail_result_t *
parasail_sg_flags_stats_scan_profile_avx2_256_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  ulong uVar1;
  __m256i alVar2;
  __m256i alVar3;
  __m256i alVar4;
  uint uVar5;
  void *pvVar6;
  parasail_matrix_t *ppVar7;
  void *pvVar8;
  void *pvVar9;
  ulong uVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  __m256i alVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  __m256i c;
  __m256i c_00;
  __m256i c_01;
  undefined1 auVar18 [32];
  char cVar19;
  byte bVar20;
  char cVar21;
  int iVar22;
  uint uVar23;
  int iVar24;
  parasail_result_t *ppVar25;
  __m256i *b;
  __m256i *b_00;
  __m256i *b_01;
  __m256i *b_02;
  __m256i *ptr;
  __m256i *b_03;
  __m256i *b_04;
  __m256i *b_05;
  __m256i *ptr_00;
  __m256i *ptr_01;
  __m256i *ptr_02;
  __m256i *ptr_03;
  __m256i *ptr_04;
  __m256i *ptr_05;
  int8_t *ptr_06;
  long lVar26;
  char cVar27;
  int iVar28;
  uint uVar29;
  int iVar30;
  __m256i *palVar31;
  long lVar32;
  char cVar33;
  uint uVar34;
  uint uVar35;
  ulong uVar36;
  int iVar37;
  long lVar38;
  uint uVar39;
  ulong uVar40;
  bool bVar41;
  undefined1 uVar42;
  char cVar43;
  undefined1 auVar45 [16];
  undefined1 auVar44 [16];
  undefined1 auVar52 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar51 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar57 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [24];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [64];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [64];
  undefined1 auVar68 [32];
  undefined1 auVar69 [64];
  byte bVar72;
  undefined1 auVar70 [32];
  undefined1 auVar71 [64];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [64];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [32];
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [64];
  undefined1 in_stack_fffffffffffffc28 [12];
  uint uVar89;
  undefined4 uVar90;
  undefined1 local_318 [32];
  undefined1 local_2f8 [32];
  undefined1 local_2d8 [32];
  undefined1 local_238 [32];
  undefined1 local_1f8 [32];
  undefined1 local_198 [32];
  undefined1 auVar50 [32];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_stats_scan_profile_avx2_256_8_cold_8();
  }
  else {
    pvVar6 = (profile->profile8).score;
    if (pvVar6 == (void *)0x0) {
      parasail_sg_flags_stats_scan_profile_avx2_256_8_cold_7();
    }
    else {
      ppVar7 = profile->matrix;
      if (ppVar7 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_stats_scan_profile_avx2_256_8_cold_6();
      }
      else {
        uVar5 = profile->s1Len;
        if ((int)uVar5 < 1) {
          parasail_sg_flags_stats_scan_profile_avx2_256_8_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_stats_scan_profile_avx2_256_8_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sg_flags_stats_scan_profile_avx2_256_8_cold_3();
        }
        else if (open < 0) {
          parasail_sg_flags_stats_scan_profile_avx2_256_8_cold_2();
        }
        else if (gap < 0) {
          parasail_sg_flags_stats_scan_profile_avx2_256_8_cold_1();
        }
        else {
          uVar34 = uVar5 - 1;
          uVar40 = (ulong)uVar5 + 0x1f >> 5;
          uVar10 = (ulong)uVar34 % uVar40;
          iVar24 = (int)(uVar34 / uVar40);
          iVar22 = ppVar7->min;
          pvVar8 = (profile->profile8).matches;
          local_318._4_4_ = -open;
          uVar23 = (uint)(byte)-(char)iVar22;
          if (iVar22 != local_318._4_4_ && SBORROW4(iVar22,local_318._4_4_) == iVar22 + open < 0) {
            uVar23 = open;
          }
          pvVar9 = (profile->profile8).similar;
          cVar19 = '~' - (char)ppVar7->max;
          ppVar25 = parasail_result_new_stats();
          if (ppVar25 != (parasail_result_t *)0x0) {
            ppVar25->flag =
                 (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar25->flag | 0x20110402;
            b = parasail_memalign___m256i(0x20,uVar40);
            b_00 = parasail_memalign___m256i(0x20,uVar40);
            b_01 = parasail_memalign___m256i(0x20,uVar40);
            b_02 = parasail_memalign___m256i(0x20,uVar40);
            uVar89 = (uint)uVar40;
            uVar90 = 0;
            ptr = parasail_memalign___m256i(0x20,uVar40);
            b_03 = parasail_memalign___m256i(0x20,uVar40);
            b_04 = parasail_memalign___m256i(0x20,uVar40);
            b_05 = parasail_memalign___m256i(0x20,uVar40);
            ptr_00 = parasail_memalign___m256i(0x20,CONCAT44(uVar90,uVar89));
            ptr_01 = parasail_memalign___m256i(0x20,CONCAT44(uVar90,uVar89));
            ptr_02 = parasail_memalign___m256i(0x20,CONCAT44(uVar90,uVar89));
            ptr_03 = parasail_memalign___m256i(0x20,CONCAT44(uVar90,uVar89));
            ptr_04 = parasail_memalign___m256i(0x20,CONCAT44(uVar90,uVar89));
            ptr_05 = parasail_memalign___m256i(0x20,CONCAT44(uVar90,uVar89));
            ptr_06 = parasail_memalign_int8_t(0x20,(ulong)(s2Len + 1));
            auVar54._8_8_ = 0;
            auVar54._0_8_ = b;
            auVar57._8_8_ = 0;
            auVar57._0_8_ = b_00;
            auVar54 = vpunpcklqdq_avx(auVar54,auVar57);
            auVar44._8_8_ = 0;
            auVar44._0_8_ = b_01;
            auVar52._8_8_ = 0;
            auVar52._0_8_ = b_02;
            auVar57 = vpunpcklqdq_avx(auVar44,auVar52);
            auVar44 = ZEXT116(0) * auVar57 + ZEXT116(1) * auVar54;
            auVar52 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar57;
            auVar53._8_8_ = 0;
            auVar53._0_8_ = ptr;
            auVar58._8_8_ = 0;
            auVar58._0_8_ = b_03;
            auVar54 = vpunpcklqdq_avx(auVar53,auVar58);
            auVar59._8_8_ = 0;
            auVar59._0_8_ = b_04;
            auVar65._8_8_ = 0;
            auVar65._0_8_ = b_05;
            auVar57 = vpunpcklqdq_avx(auVar59,auVar65);
            auVar54 = ZEXT116(0) * auVar57 + ZEXT116(1) * auVar54;
            auVar57 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar57;
            auVar46._0_8_ = -(ulong)(auVar44._0_8_ == 0);
            auVar46._8_8_ = -(ulong)(auVar44._8_8_ == 0);
            auVar46._16_8_ = -(ulong)(auVar52._0_8_ == 0);
            auVar46._24_8_ = -(ulong)(auVar52._8_8_ == 0);
            auVar62._0_8_ = -(ulong)(auVar54._0_8_ == 0);
            auVar62._8_8_ = -(ulong)(auVar54._8_8_ == 0);
            auVar62._16_8_ = -(ulong)(auVar57._0_8_ == 0);
            auVar62._24_8_ = -(ulong)(auVar57._8_8_ == 0);
            auVar46 = vpackssdw_avx2(auVar46,auVar62);
            if (((((ptr_04 != (__m256i *)0x0 && ptr_03 != (__m256i *)0x0) &&
                  ptr_05 != (__m256i *)0x0) &&
                 ((ptr_01 != (__m256i *)0x0 && ptr_00 != (__m256i *)0x0) && ptr_02 != (__m256i *)0x0
                 )) && ptr_06 != (int8_t *)0x0) &&
                ((((((((auVar46 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                      (auVar46 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar46 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    SUB321(auVar46 >> 0x7f,0) == '\0') &&
                   (auVar46 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  SUB321(auVar46 >> 0xbf,0) == '\0') &&
                 (auVar46 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar46[0x1f])) {
              iVar22 = s2Len + -1;
              iVar28 = 0x1f - iVar24;
              uVar42 = (undefined1)open;
              cVar43 = (char)gap;
              bVar20 = (char)uVar23 + 0x81;
              uVar23 = CONCAT31((int3)(uVar23 >> 8),bVar20);
              local_198[1] = (undefined1)iVar28;
              local_198[0] = local_198[1];
              local_198[2] = local_198[1];
              local_198[3] = local_198[1];
              local_198[4] = local_198[1];
              local_198[5] = local_198[1];
              local_198[6] = local_198[1];
              local_198[7] = local_198[1];
              local_198[8] = local_198[1];
              local_198[9] = local_198[1];
              local_198[10] = local_198[1];
              local_198[0xb] = local_198[1];
              local_198[0xc] = local_198[1];
              local_198[0xd] = local_198[1];
              local_198[0xe] = local_198[1];
              local_198[0xf] = local_198[1];
              local_198[0x10] = local_198[1];
              local_198[0x11] = local_198[1];
              local_198[0x12] = local_198[1];
              local_198[0x13] = local_198[1];
              local_198[0x14] = local_198[1];
              local_198[0x15] = local_198[1];
              local_198[0x16] = local_198[1];
              local_198[0x17] = local_198[1];
              local_198[0x18] = local_198[1];
              local_198[0x19] = local_198[1];
              local_198[0x1a] = local_198[1];
              local_198[0x1b] = local_198[1];
              local_198[0x1c] = local_198[1];
              local_198[0x1d] = local_198[1];
              local_198[0x1e] = local_198[1];
              local_198[0x1f] = local_198[1];
              auVar47[0] = (char)uVar89;
              auVar47[1] = auVar47[0];
              auVar47[2] = auVar47[0];
              auVar47[3] = auVar47[0];
              auVar47[4] = auVar47[0];
              auVar47[5] = auVar47[0];
              auVar47[6] = auVar47[0];
              auVar47[7] = auVar47[0];
              auVar47[8] = auVar47[0];
              auVar47[9] = auVar47[0];
              auVar47[10] = auVar47[0];
              auVar47[0xb] = auVar47[0];
              auVar47[0xc] = auVar47[0];
              auVar47[0xd] = auVar47[0];
              auVar47[0xe] = auVar47[0];
              auVar47[0xf] = auVar47[0];
              auVar47[0x10] = auVar47[0];
              auVar47[0x11] = auVar47[0];
              auVar47[0x12] = auVar47[0];
              auVar47[0x13] = auVar47[0];
              auVar47[0x14] = auVar47[0];
              auVar47[0x15] = auVar47[0];
              auVar47[0x16] = auVar47[0];
              auVar47[0x17] = auVar47[0];
              auVar47[0x18] = auVar47[0];
              auVar47[0x19] = auVar47[0];
              auVar47[0x1a] = auVar47[0];
              auVar47[0x1b] = auVar47[0];
              auVar47[0x1c] = auVar47[0];
              auVar47[0x1d] = auVar47[0];
              auVar47[0x1e] = auVar47[0];
              auVar47[0x1f] = auVar47[0];
              auVar46 = vpmovsxwq_avx2(ZEXT816(0xffffffffffffff00));
              auVar12 = vpand_avx2(auVar47,auVar46);
              cVar21 = -(auVar47[0] * cVar43);
              auVar48[1] = cVar21;
              auVar48[0] = cVar21;
              auVar48[2] = cVar21;
              auVar48[3] = cVar21;
              auVar48[4] = cVar21;
              auVar48[5] = cVar21;
              auVar48[6] = cVar21;
              auVar48[7] = cVar21;
              auVar48[8] = cVar21;
              auVar48[9] = cVar21;
              auVar48[10] = cVar21;
              auVar48[0xb] = cVar21;
              auVar48[0xc] = cVar21;
              auVar48[0xd] = cVar21;
              auVar48[0xe] = cVar21;
              auVar48[0xf] = cVar21;
              auVar48[0x10] = cVar21;
              auVar48[0x11] = cVar21;
              auVar48[0x12] = cVar21;
              auVar48[0x13] = cVar21;
              auVar48[0x14] = cVar21;
              auVar48[0x15] = cVar21;
              auVar48[0x16] = cVar21;
              auVar48[0x17] = cVar21;
              auVar48[0x18] = cVar21;
              auVar48[0x19] = cVar21;
              auVar48[0x1a] = cVar21;
              auVar48[0x1b] = cVar21;
              auVar48[0x1c] = cVar21;
              auVar48[0x1d] = cVar21;
              auVar48[0x1e] = cVar21;
              auVar48[0x1f] = cVar21;
              auVar46 = vpand_avx2(auVar48,auVar46);
              auVar46 = vpaddsb_avx2(ZEXT132(bVar20),auVar46);
              alVar13[1]._4_4_ = uVar23;
              alVar13._0_12_ = in_stack_fffffffffffffc28;
              alVar13[2]._0_4_ = uVar89;
              alVar13[2]._4_4_ = uVar90;
              alVar13[3]._0_4_ = uVar34;
              alVar13[3]._4_4_ = iVar22;
              parasail_memset___m256i(b_03,alVar13,CONCAT44(uVar90,uVar89));
              alVar2[1]._4_4_ = uVar23;
              alVar2._0_12_ = in_stack_fffffffffffffc28;
              alVar2[2]._0_4_ = uVar89;
              alVar2[2]._4_4_ = uVar90;
              alVar2[3]._0_4_ = uVar34;
              alVar2[3]._4_4_ = iVar22;
              parasail_memset___m256i(b_04,alVar2,CONCAT44(uVar90,uVar89));
              alVar3[1]._4_4_ = uVar23;
              alVar3._0_12_ = in_stack_fffffffffffffc28;
              alVar3[2]._0_4_ = uVar89;
              alVar3[2]._4_4_ = uVar90;
              alVar3[3]._0_4_ = uVar34;
              alVar3[3]._4_4_ = iVar22;
              parasail_memset___m256i(b_05,alVar3,CONCAT44(uVar90,uVar89));
              alVar4[1]._4_4_ = uVar23;
              alVar4._0_12_ = in_stack_fffffffffffffc28;
              alVar4[2]._0_4_ = uVar89;
              alVar4[2]._4_4_ = uVar90;
              alVar4[3]._0_4_ = uVar34;
              alVar4[3]._4_4_ = iVar22;
              parasail_memset___m256i(b,alVar4,CONCAT44(uVar90,uVar89));
              c[1]._4_4_ = uVar23;
              c._0_12_ = in_stack_fffffffffffffc28;
              c[2]._0_4_ = uVar89;
              c[2]._4_4_ = uVar90;
              c[3]._0_4_ = uVar34;
              c[3]._4_4_ = iVar22;
              parasail_memset___m256i(b_00,c,CONCAT44(uVar90,uVar89));
              c_00[1]._4_4_ = uVar23;
              c_00._0_12_ = in_stack_fffffffffffffc28;
              c_00[2]._0_4_ = uVar89;
              c_00[2]._4_4_ = uVar90;
              c_00[3]._0_4_ = uVar34;
              c_00[3]._4_4_ = iVar22;
              parasail_memset___m256i(b_01,c_00,CONCAT44(uVar90,uVar89));
              c_01[1]._4_4_ = uVar23;
              c_01._0_12_ = in_stack_fffffffffffffc28;
              c_01[2]._0_4_ = uVar89;
              c_01[2]._4_4_ = uVar90;
              c_01[3]._0_4_ = uVar34;
              c_01[3]._4_4_ = iVar22;
              parasail_memset___m256i(b_02,c_01,CONCAT44(uVar90,uVar89));
              auVar14[1] = cVar43;
              auVar14[0] = cVar43;
              auVar14[2] = cVar43;
              auVar14[3] = cVar43;
              auVar14[4] = cVar43;
              auVar14[5] = cVar43;
              auVar14[6] = cVar43;
              auVar14[7] = cVar43;
              auVar14[8] = cVar43;
              auVar14[9] = cVar43;
              auVar14[10] = cVar43;
              auVar14[0xb] = cVar43;
              auVar14[0xc] = cVar43;
              auVar14[0xd] = cVar43;
              auVar14[0xe] = cVar43;
              auVar14[0xf] = cVar43;
              auVar14[0x10] = cVar43;
              auVar14[0x11] = cVar43;
              auVar14[0x12] = cVar43;
              auVar14[0x13] = cVar43;
              auVar14[0x14] = cVar43;
              auVar14[0x15] = cVar43;
              auVar14[0x16] = cVar43;
              auVar14[0x17] = cVar43;
              auVar14[0x18] = cVar43;
              auVar14[0x19] = cVar43;
              auVar14[0x1a] = cVar43;
              auVar14[0x1b] = cVar43;
              auVar14[0x1c] = cVar43;
              auVar14[0x1d] = cVar43;
              auVar14[0x1e] = cVar43;
              auVar14[0x1f] = cVar43;
              auVar17[1] = uVar42;
              auVar17[0] = uVar42;
              auVar17[2] = uVar42;
              auVar17[3] = uVar42;
              auVar17[4] = uVar42;
              auVar17[5] = uVar42;
              auVar17[6] = uVar42;
              auVar17[7] = uVar42;
              auVar17[8] = uVar42;
              auVar17[9] = uVar42;
              auVar17[10] = uVar42;
              auVar17[0xb] = uVar42;
              auVar17[0xc] = uVar42;
              auVar17[0xd] = uVar42;
              auVar17[0xe] = uVar42;
              auVar17[0xf] = uVar42;
              auVar17[0x10] = uVar42;
              auVar17[0x11] = uVar42;
              auVar17[0x12] = uVar42;
              auVar17[0x13] = uVar42;
              auVar17[0x14] = uVar42;
              auVar17[0x15] = uVar42;
              auVar17[0x16] = uVar42;
              auVar17[0x17] = uVar42;
              auVar17[0x18] = uVar42;
              auVar17[0x19] = uVar42;
              auVar17[0x1a] = uVar42;
              auVar17[0x1b] = uVar42;
              auVar17[0x1c] = uVar42;
              auVar17[0x1d] = uVar42;
              auVar17[0x1e] = uVar42;
              auVar17[0x1f] = uVar42;
              auVar17 = vpsubsb_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar17);
              uVar40 = (ulong)(uVar89 - 1);
              lVar26 = uVar40 << 5;
              auVar56[8] = 1;
              auVar56._0_8_ = 0x101010101010101;
              auVar56[9] = 1;
              auVar56[10] = 1;
              auVar56[0xb] = 1;
              auVar56[0xc] = 1;
              auVar56[0xd] = 1;
              auVar56[0xe] = 1;
              auVar56[0xf] = 1;
              auVar56[0x10] = 1;
              auVar56[0x11] = 1;
              auVar56[0x12] = 1;
              auVar56[0x13] = 1;
              auVar56[0x14] = 1;
              auVar56[0x15] = 1;
              auVar56[0x16] = 1;
              auVar56[0x17] = 1;
              auVar56[0x18] = 1;
              auVar56[0x19] = 1;
              auVar56[0x1a] = 1;
              auVar56[0x1b] = 1;
              auVar56[0x1c] = 1;
              auVar56[0x1d] = 1;
              auVar56[0x1e] = 1;
              auVar56[0x1f] = 1;
              auVar62 = auVar56;
              uVar35 = uVar89;
              do {
                *(undefined1 (*) [32])((long)*ptr_04 + lVar26) = auVar17;
                *(undefined1 (*) [32])((long)*ptr_05 + lVar26) = auVar62;
                auVar17 = vpsubsb_avx2(auVar17,auVar14);
                auVar62 = vpaddsb_avx2(auVar62,auVar56);
                lVar26 = lVar26 + -0x20;
                uVar29 = uVar35 - 1;
                bVar41 = 0 < (int)uVar35;
                uVar35 = uVar29;
              } while (uVar29 != 0 && bVar41);
              bVar41 = s1_beg != 0;
              auVar49._4_4_ = 0;
              auVar49._0_4_ = gap;
              lVar26 = (long)(int)local_318._4_4_;
              auVar49._8_4_ = gap;
              auVar49._12_4_ = 0;
              auVar49._16_4_ = gap;
              auVar49._20_4_ = 0;
              auVar49._24_4_ = gap;
              auVar49._28_4_ = 0;
              auVar55._8_8_ = lVar26;
              auVar55._0_8_ = lVar26;
              auVar55._16_8_ = lVar26;
              auVar55._24_8_ = lVar26;
              auVar61._8_4_ = uVar89;
              auVar61._0_8_ = CONCAT44(0,uVar89);
              auVar61._12_4_ = 0;
              auVar61._16_4_ = uVar89;
              auVar61._20_4_ = 0;
              auVar61._24_4_ = uVar89;
              auVar61._28_4_ = 0;
              auVar17 = vpmuldq_avx2(auVar61,_DAT_00908f20);
              auVar14 = vpmuldq_avx2(auVar61,_DAT_00908f40);
              auVar47 = vpmuldq_avx2(auVar61,_DAT_00908f60);
              auVar48 = vpmuldq_avx2(auVar61,_DAT_00908f80);
              auVar56 = vpmuldq_avx2(auVar61,_DAT_00908e00);
              auVar50 = vpmuldq_avx2(auVar61,_DAT_00908e20);
              auVar82 = vpmuldq_avx2(auVar61,_DAT_00908c60);
              auVar61 = vpmuldq_avx2(auVar61,_DAT_00908b60);
              auVar85[1] = bVar41;
              auVar85[0] = bVar41;
              auVar85[2] = bVar41;
              auVar85[3] = bVar41;
              auVar85[4] = bVar41;
              auVar85[5] = bVar41;
              auVar85[6] = bVar41;
              auVar85[7] = bVar41;
              auVar85[8] = bVar41;
              auVar85[9] = bVar41;
              auVar85[10] = bVar41;
              auVar85[0xb] = bVar41;
              auVar85[0xc] = bVar41;
              auVar85[0xd] = bVar41;
              auVar85[0xe] = bVar41;
              auVar85[0xf] = bVar41;
              auVar85[0x10] = bVar41;
              auVar85[0x11] = bVar41;
              auVar85[0x12] = bVar41;
              auVar85[0x13] = bVar41;
              auVar85[0x14] = bVar41;
              auVar85[0x15] = bVar41;
              auVar85[0x16] = bVar41;
              auVar85[0x17] = bVar41;
              auVar85[0x18] = bVar41;
              auVar85[0x19] = bVar41;
              auVar85[0x1a] = bVar41;
              auVar85[0x1b] = bVar41;
              auVar85[0x1c] = bVar41;
              auVar85[0x1d] = bVar41;
              auVar85[0x1e] = bVar41;
              auVar85[0x1f] = bVar41;
              lVar26 = 0;
              auVar80._8_8_ = 0xffffffffffffff80;
              auVar80._0_8_ = 0xffffffffffffff80;
              auVar80._16_8_ = 0xffffffffffffff80;
              auVar80._24_8_ = 0xffffffffffffff80;
              auVar81._8_8_ = 0xff;
              auVar81._0_8_ = 0xff;
              auVar81._16_8_ = 0xff;
              auVar81._24_8_ = 0xff;
              auVar62 = vpsllw_avx2(auVar85,7);
              auVar62 = vpcmpgtb_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar62);
              palVar31 = ptr;
              do {
                auVar63._8_8_ = lVar26;
                auVar63._0_8_ = lVar26;
                auVar63._16_8_ = lVar26;
                auVar63._24_8_ = lVar26;
                auVar85 = vpaddq_avx2(auVar63,auVar82);
                auVar66 = vpaddq_avx2(auVar61,auVar63);
                auVar73 = vpaddq_avx2(auVar63,auVar50);
                auVar70 = vpaddq_avx2(auVar63,auVar56);
                auVar68 = vpaddq_avx2(auVar63,auVar48);
                auVar74 = vpaddq_avx2(auVar63,auVar47);
                auVar87 = vpaddq_avx2(auVar63,auVar14);
                auVar63 = vpaddq_avx2(auVar63,auVar17);
                auVar15 = vpmuludq_avx2(auVar63,auVar49);
                auVar63 = vpsrlq_avx2(auVar63,0x20);
                auVar63 = vpmuludq_avx2(auVar63,auVar49);
                auVar63 = vpsllq_avx2(auVar63,0x20);
                auVar63 = vpaddq_avx2(auVar15,auVar63);
                auVar15 = vpmuludq_avx2(auVar87,auVar49);
                auVar87 = vpsrlq_avx2(auVar87,0x20);
                auVar87 = vpmuludq_avx2(auVar87,auVar49);
                auVar87 = vpsllq_avx2(auVar87,0x20);
                auVar87 = vpaddq_avx2(auVar87,auVar15);
                auVar15 = vpmuludq_avx2(auVar74,auVar49);
                auVar74 = vpsrlq_avx2(auVar74,0x20);
                auVar74 = vpmuludq_avx2(auVar74,auVar49);
                auVar74 = vpsllq_avx2(auVar74,0x20);
                auVar74 = vpaddq_avx2(auVar15,auVar74);
                auVar15 = vpmuludq_avx2(auVar68,auVar49);
                auVar68 = vpsrlq_avx2(auVar68,0x20);
                auVar68 = vpmuludq_avx2(auVar68,auVar49);
                auVar68 = vpsllq_avx2(auVar68,0x20);
                auVar15 = vpaddq_avx2(auVar15,auVar68);
                auVar68 = vpmuludq_avx2(auVar70,auVar49);
                auVar70 = vpsrlq_avx2(auVar70,0x20);
                auVar70 = vpmuludq_avx2(auVar70,auVar49);
                auVar70 = vpsllq_avx2(auVar70,0x20);
                auVar51 = vpaddq_avx2(auVar68,auVar70);
                auVar70 = vpmuludq_avx2(auVar73,auVar49);
                auVar73 = vpsrlq_avx2(auVar73,0x20);
                auVar73 = vpmuludq_avx2(auVar73,auVar49);
                auVar73 = vpsllq_avx2(auVar73,0x20);
                auVar11 = vpaddq_avx2(auVar70,auVar73);
                auVar73 = vpmuludq_avx2(auVar66,auVar49);
                auVar66 = vpsrlq_avx2(auVar66,0x20);
                auVar66 = vpmuludq_avx2(auVar66,auVar49);
                auVar66 = vpsllq_avx2(auVar66,0x20);
                auVar66 = vpaddq_avx2(auVar73,auVar66);
                auVar73 = vpmuludq_avx2(auVar85,auVar49);
                auVar85 = vpsrlq_avx2(auVar85,0x20);
                auVar85 = vpmuludq_avx2(auVar85,auVar49);
                auVar85 = vpsllq_avx2(auVar85,0x20);
                auVar85 = vpaddq_avx2(auVar85,auVar73);
                auVar16 = vpsubq_avx2(auVar55,auVar85);
                auVar73 = vpsubq_avx2(auVar55,auVar63);
                auVar85 = vpcmpgtq_avx2(auVar73,auVar80);
                auVar70 = vblendvpd_avx(auVar80,auVar73,auVar85);
                auVar73 = vpsubq_avx2(auVar55,auVar87);
                auVar85 = vpcmpgtq_avx2(auVar73,auVar80);
                auVar68 = vblendvpd_avx(auVar80,auVar73,auVar85);
                auVar73 = vpsubq_avx2(auVar55,auVar74);
                auVar85 = vpcmpgtq_avx2(auVar73,auVar80);
                auVar74 = vblendvpd_avx(auVar80,auVar73,auVar85);
                auVar73 = vpsubq_avx2(auVar55,auVar15);
                auVar85 = vpcmpgtq_avx2(auVar73,auVar80);
                auVar87 = vblendvpd_avx(auVar80,auVar73,auVar85);
                auVar73 = vpsubq_avx2(auVar55,auVar51);
                auVar85 = vpcmpgtq_avx2(auVar73,auVar80);
                auVar73 = vblendvpd_avx(auVar80,auVar73,auVar85);
                auVar63 = vpsubq_avx2(auVar55,auVar11);
                auVar85 = vpcmpgtq_avx2(auVar63,auVar80);
                auVar63 = vblendvpd_avx(auVar80,auVar63,auVar85);
                auVar66 = vpsubq_avx2(auVar55,auVar66);
                auVar85 = vpcmpgtq_avx2(auVar66,auVar80);
                auVar66 = vblendvpd_avx(auVar80,auVar66,auVar85);
                auVar85 = vpcmpgtq_avx2(auVar16,auVar80);
                auVar85 = vblendvpd_avx(auVar80,auVar16,auVar85);
                auVar85 = vandpd_avx(auVar85,auVar81);
                auVar66 = vandpd_avx(auVar81,auVar66);
                auVar15 = vpackusdw_avx2(auVar66,auVar85);
                auVar66 = vandpd_avx(auVar81,auVar63);
                auVar73 = vandpd_avx(auVar81,auVar73);
                auVar66 = vpackusdw_avx2(auVar66,auVar73);
                auVar73 = vpermq_avx2(auVar15,0xd8);
                auVar66 = vpermq_avx2(auVar66,0xd8);
                auVar63 = vpackusdw_avx2(auVar73,auVar66);
                auVar66 = vandpd_avx(auVar81,auVar87);
                auVar73 = vandpd_avx(auVar81,auVar74);
                auVar74 = vpackusdw_avx2(auVar66,auVar73);
                auVar66 = vandpd_avx(auVar68,auVar81);
                auVar73 = vandpd_avx(auVar81,auVar70);
                auVar66 = vpackusdw_avx2(auVar66,auVar73);
                auVar73 = vpermq_avx2(auVar74,0xd8);
                auVar66 = vpermq_avx2(auVar66,0xd8);
                auVar66 = vpackusdw_avx2(auVar73,auVar66);
                auVar73 = vpermq_avx2(auVar63,0xd8);
                auVar66 = vpermq_avx2(auVar66,0xd8);
                auVar66 = vpackuswb_avx2(auVar73,auVar66);
                auVar66 = vpermq_avx2(auVar66,0xd8);
                alVar13 = (__m256i)vpandn_avx2(auVar62,auVar66);
                *palVar31 = alVar13;
                lVar26 = lVar26 + 1;
                palVar31 = palVar31 + 1;
              } while (CONCAT44(uVar90,uVar89) != lVar26);
              *ptr_06 = '\0';
              lVar26 = (ulong)(uint)s2Len - 1;
              auVar45._8_8_ = lVar26;
              auVar45._0_8_ = lVar26;
              auVar50._16_8_ = lVar26;
              auVar50._0_16_ = auVar45;
              auVar50._24_8_ = lVar26;
              local_2f8._4_4_ = gap;
              local_2f8._0_4_ = gap;
              local_2f8._8_4_ = gap;
              local_2f8._12_4_ = gap;
              local_2f8._16_4_ = gap;
              local_2f8._20_4_ = gap;
              local_2f8._24_4_ = gap;
              local_2f8._28_4_ = gap;
              local_318._0_4_ = local_318._4_4_;
              local_318._8_4_ = local_318._4_4_;
              local_318._12_4_ = local_318._4_4_;
              local_318._16_4_ = local_318._4_4_;
              local_318._20_4_ = local_318._4_4_;
              local_318._24_4_ = local_318._4_4_;
              local_318._28_4_ = local_318._4_4_;
              auVar47 = vpmovsxbd_avx2(ZEXT816(0x201f1e1d1c1b1a19));
              auVar14 = vpmovsxbd_avx2(ZEXT816(0x1817161514131211));
              auVar17 = vpmovsxbd_avx2(ZEXT816(0x100f0e0d0c0b0a09));
              auVar62 = vpmovsxbd_avx2(ZEXT816(0x807060504030201));
              uVar36 = 0;
              auVar86._8_8_ = 0x8000000000000000;
              auVar86._0_8_ = 0x8000000000000000;
              auVar54 = vpcmpeqd_avx(auVar15._0_16_,auVar15._0_16_);
              auVar48 = vpcmpeqd_avx2(auVar85,auVar85);
              local_2d8._8_4_ = 0xffffff80;
              local_2d8._0_8_ = 0xffffff80ffffff80;
              local_2d8._12_4_ = 0xffffff80;
              local_2d8._16_4_ = 0xffffff80;
              local_2d8._20_4_ = 0xffffff80;
              local_2d8._24_4_ = 0xffffff80;
              local_2d8._28_4_ = 0xffffff80;
              local_1f8._8_4_ = 0xff;
              local_1f8._0_8_ = 0xff000000ff;
              local_1f8._12_4_ = 0xff;
              local_1f8._16_4_ = 0xff;
              local_1f8._20_4_ = 0xff;
              local_1f8._24_4_ = 0xff;
              local_1f8._28_4_ = 0xff;
              auVar82._8_8_ = 0x8000000000000000;
              auVar82._0_8_ = 0x8000000000000000;
              auVar82._16_8_ = 0x8000000000000000;
              auVar82._24_8_ = 0x8000000000000000;
              auVar56 = ZEXT1632(CONCAT412(4,CONCAT48(4,0x400000004)));
              auVar66._8_4_ = 0x20;
              auVar66._0_8_ = 0x2000000020;
              auVar66._12_4_ = 0x20;
              auVar66._16_4_ = 0x20;
              auVar66._20_4_ = 0x20;
              auVar66._24_4_ = 0x20;
              auVar66._28_4_ = 0x20;
              do {
                if (s2_beg == 0) {
                  auVar61 = vpaddd_avx2(auVar48,auVar62);
                  auVar49 = vpaddd_avx2(auVar48,auVar17);
                  auVar55 = vpaddd_avx2(auVar48,auVar14);
                  auVar85 = vpaddd_avx2(auVar48,auVar47);
                  auVar85 = vpmulld_avx2(auVar85,local_2f8);
                  auVar55 = vpmulld_avx2(auVar55,local_2f8);
                  auVar49 = vpmulld_avx2(auVar49,local_2f8);
                  auVar61 = vpmulld_avx2(auVar61,local_2f8);
                  auVar61 = vpsubd_avx2(local_318,auVar61);
                  auVar49 = vpsubd_avx2(local_318,auVar49);
                  auVar80 = vpsubd_avx2(local_318,auVar55);
                  auVar55 = vpsubd_avx2(local_318,auVar85);
                  auVar55 = vpmaxsd_avx2(auVar55,local_2d8);
                  auVar85 = vpmaxsd_avx2(auVar80,local_2d8);
                  auVar49 = vpmaxsd_avx2(auVar49,local_2d8);
                  auVar61 = vpmaxsd_avx2(auVar61,local_2d8);
                  auVar61 = vpand_avx2(local_1f8,auVar61);
                  auVar49 = vpand_avx2(local_1f8,auVar49);
                  auVar61 = vpackusdw_avx2(auVar61,auVar49);
                  auVar80 = vpermq_avx2(auVar61,0xd8);
                  auVar61 = vpand_avx2(auVar85,local_1f8);
                  auVar49 = vpand_avx2(auVar55,local_1f8);
                  auVar61 = vpackusdw_avx2(auVar61,auVar49);
                  auVar61 = vpermq_avx2(auVar61,0xd8);
                  auVar61 = vpackuswb_avx2(auVar80,auVar61);
                  auVar61 = vpermq_avx2(auVar61,0xd8);
                  auVar60 = auVar61._0_24_;
                }
                else {
                  auVar60 = SUB6424(ZEXT1664((undefined1  [16])0x0),0);
                }
                auVar73._8_8_ = uVar36;
                auVar73._0_8_ = uVar36;
                auVar73._16_8_ = uVar36;
                auVar73._24_8_ = uVar36;
                auVar61 = vpor_avx2(auVar73,_DAT_00908b60);
                auVar57 = vpcmpgtq_avx(auVar61._0_16_ ^ auVar86,auVar86 ^ auVar45);
                auVar57 = vpackssdw_avx(auVar57,auVar57);
                auVar57 = vpackssdw_avx(auVar57 ^ auVar54,auVar57 ^ auVar54);
                auVar57 = vpacksswb_avx(auVar57,auVar57);
                if ((auVar57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_06[uVar36 + 1] = auVar60[0];
                }
                auVar57 = vpcmpgtq_avx(auVar61._0_16_ ^ auVar86,auVar86 ^ auVar45);
                auVar57 = vpackssdw_avx(auVar57,auVar57);
                auVar57 = vpackssdw_avx(auVar57 ^ auVar54,auVar57 ^ auVar54);
                auVar57 = vpacksswb_avx(auVar57,auVar57);
                if ((auVar57 >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_06[uVar36 + 2] = auVar60[1];
                }
                auVar55 = auVar82 ^ auVar50;
                auVar61 = vpcmpgtq_avx2(auVar61 ^ auVar82,auVar55);
                auVar49 = vpshuflw_avx2(auVar61,0xe8);
                auVar49 = vpermd_avx2(auVar56,auVar49 ^ auVar48);
                auVar57 = vpackssdw_avx(auVar49._0_16_,auVar49._0_16_);
                auVar57 = vpacksswb_avx(auVar57,auVar57);
                if ((auVar57 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_06[uVar36 + 3] = auVar60[2];
                }
                auVar57 = vpackssdw_avx(auVar61._16_16_,auVar61._16_16_);
                auVar57 = vpackssdw_avx(auVar57 ^ auVar54,auVar57 ^ auVar54);
                auVar57 = vpacksswb_avx(auVar57,auVar57);
                if ((auVar57 >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_06[uVar36 + 4] = auVar60[3];
                }
                auVar49 = vpor_avx2(auVar73,_DAT_00908c60);
                auVar57 = vpcmpgtq_avx(auVar49._0_16_ ^ auVar86,auVar86 ^ auVar45);
                auVar57 = vpackssdw_avx(auVar57,auVar57);
                auVar61 = vpermq_avx2(ZEXT1632(auVar57 ^ auVar54),0x55);
                auVar61 = vpackssdw_avx2(auVar61,auVar50);
                auVar76._0_2_ = auVar61._16_2_;
                auVar76._2_2_ = auVar76._0_2_;
                auVar76._4_2_ = auVar76._0_2_;
                auVar76._6_2_ = auVar76._0_2_;
                auVar76._8_2_ = auVar76._0_2_;
                auVar76._10_2_ = auVar76._0_2_;
                auVar76._12_2_ = auVar76._0_2_;
                auVar76._14_2_ = auVar76._0_2_;
                auVar57 = vpacksswb_avx(auVar76,auVar76);
                if ((auVar57 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_06[uVar36 + 5] = auVar60[4];
                }
                auVar57 = vpcmpgtq_avx(auVar49._0_16_ ^ auVar86,auVar86 ^ auVar45);
                auVar57 = vpshufhw_avx(auVar57,0x84);
                auVar61 = vpermq_avx2(ZEXT1632(auVar57 ^ auVar54),0x55);
                auVar61 = vpackssdw_avx2(auVar61,auVar50);
                auVar77._0_4_ = auVar61._16_4_;
                auVar77._4_4_ = auVar77._0_4_;
                auVar77._8_4_ = auVar77._0_4_;
                auVar77._12_4_ = auVar77._0_4_;
                auVar57 = vpacksswb_avx(auVar77,auVar77);
                if ((auVar57 >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_06[uVar36 + 6] = auVar60[5];
                }
                auVar49 = vpcmpgtq_avx2(auVar49 ^ auVar82,auVar55);
                auVar61 = vpackssdw_avx2(auVar50,auVar49);
                auVar57 = auVar61._16_16_ ^ auVar54;
                auVar57 = vpackssdw_avx(auVar57,auVar57);
                auVar57 = vpacksswb_avx(auVar57,auVar57);
                if ((auVar57 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_06[uVar36 + 7] = auVar60[6];
                }
                auVar61 = vpshufhw_avx2(auVar49,0x84);
                auVar57 = auVar61._16_16_ ^ auVar54;
                auVar57 = vpackssdw_avx(auVar57,auVar57);
                auVar57 = vpacksswb_avx(auVar57,auVar57);
                if ((auVar57 >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_06[uVar36 + 8] = auVar60[7];
                }
                auVar49 = vpor_avx2(auVar73,_DAT_00908e20);
                auVar57 = vpcmpgtq_avx(auVar49._0_16_ ^ auVar86,auVar86 ^ auVar45);
                auVar57 = vpackssdw_avx(auVar57,auVar57);
                auVar57 = vpackssdw_avx(auVar57 ^ auVar54,auVar57 ^ auVar54);
                auVar61 = vpmovzxwd_avx2(auVar57);
                auVar61 = vpacksswb_avx2(auVar61,auVar50);
                if ((auVar61 & (undefined1  [32])0x1) != (undefined1  [32])0x0) {
                  ptr_06[uVar36 + 9] = auVar60[0];
                }
                auVar57 = vpcmpgtq_avx(auVar49._0_16_ ^ auVar86,auVar86 ^ auVar45);
                auVar57 = vpackssdw_avx(auVar57,auVar57);
                auVar57 = vpackssdw_avx(auVar57 ^ auVar54,auVar57 ^ auVar54);
                auVar61 = vpermq_avx2(ZEXT1632(auVar57),0x55);
                auVar61 = vpacksswb_avx2(auVar61,auVar50);
                if ((auVar61._16_16_ >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_06[uVar36 + 10] = auVar60[1];
                }
                auVar49 = vpcmpgtq_avx2(auVar49 ^ auVar82,auVar55);
                auVar61 = vpshuflw_avx2(auVar49,0xe8);
                auVar61 = vpermd_avx2(auVar56,auVar61 ^ auVar48);
                auVar57 = vpackssdw_avx(auVar61._0_16_,auVar61._0_16_);
                auVar61 = vpermq_avx2(ZEXT1632(auVar57),0x55);
                auVar61 = vpacksswb_avx2(auVar61,auVar50);
                if ((auVar61._16_16_ >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_06[uVar36 + 0xb] = auVar60[2];
                }
                auVar57 = vpackssdw_avx(auVar49._16_16_,auVar49._16_16_);
                auVar57 = vpackssdw_avx(auVar57 ^ auVar54,auVar57 ^ auVar54);
                auVar61 = vpermq_avx2(ZEXT1632(auVar57),0x55);
                auVar61 = vpacksswb_avx2(auVar61,auVar50);
                if ((auVar61._16_16_ >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_06[uVar36 + 0xc] = auVar60[3];
                }
                auVar49 = vpor_avx2(auVar73,_DAT_00908e00);
                auVar57 = vpcmpgtq_avx(auVar49._0_16_ ^ auVar86,auVar86 ^ auVar45);
                auVar57 = vpackssdw_avx(auVar57,auVar57);
                auVar61 = vpermq_avx2(ZEXT1632(auVar57 ^ auVar54),0x55);
                auVar61 = vpackssdw_avx2(auVar50,auVar61);
                auVar61 = vpacksswb_avx2(auVar61,auVar50);
                if ((auVar61._16_16_ >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_06[uVar36 + 0xd] = auVar60[4];
                }
                auVar57 = vpcmpgtq_avx(auVar49._0_16_ ^ auVar86,auVar86 ^ auVar45);
                auVar57 = vpshufhw_avx(auVar57,0x84);
                auVar61 = vpermq_avx2(ZEXT1632(auVar57 ^ auVar54),0x55);
                auVar61 = vpackssdw_avx2(auVar50,auVar61);
                auVar61 = vpacksswb_avx2(auVar61,auVar50);
                if ((auVar61._16_16_ >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_06[uVar36 + 0xe] = auVar60[5];
                }
                auVar49 = vpcmpgtq_avx2(auVar49 ^ auVar82,auVar55);
                auVar61 = vpackssdw_avx2(auVar50,auVar49);
                auVar61 = vpackssdw_avx2(auVar50,auVar61 ^ auVar48);
                auVar61 = vpacksswb_avx2(auVar61,auVar50);
                if ((auVar61._16_16_ >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_06[uVar36 + 0xf] = auVar60[6];
                }
                auVar61 = vpshufhw_avx2(auVar49,0x84);
                auVar61 = vpackssdw_avx2(auVar50,auVar61 ^ auVar48);
                auVar61 = vpacksswb_avx2(auVar61,auVar50);
                if ((auVar61._16_16_ >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_06[uVar36 + 0x10] = auVar60[7];
                }
                auVar61 = vpor_avx2(auVar73,_DAT_00908f80);
                auVar57 = vpcmpgtq_avx(auVar61._0_16_ ^ auVar86,auVar86 ^ auVar45);
                auVar57 = vpackssdw_avx(auVar57,auVar57);
                auVar57 = vpackssdw_avx(auVar57 ^ auVar54,auVar57 ^ auVar54);
                auVar57 = vpacksswb_avx(auVar57,auVar57);
                if ((auVar57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_06[uVar36 + 0x11] = auVar60[0x10];
                }
                auVar57 = vpcmpgtq_avx(auVar61._0_16_ ^ auVar86,auVar86 ^ auVar45);
                auVar57 = vpackssdw_avx(auVar57,auVar57);
                auVar57 = vpackssdw_avx(auVar57 ^ auVar54,auVar57 ^ auVar54);
                auVar57 = vpacksswb_avx(auVar57,auVar57);
                if ((auVar57 >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_06[uVar36 + 0x12] = auVar60[0x11];
                }
                auVar61 = vpcmpgtq_avx2(auVar61 ^ auVar82,auVar55);
                auVar49 = vpshuflw_avx2(auVar61,0xe8);
                auVar49 = vpermd_avx2(auVar56,auVar49 ^ auVar48);
                auVar57 = vpackssdw_avx(auVar49._0_16_,auVar49._0_16_);
                auVar57 = vpacksswb_avx(auVar57,auVar57);
                if ((auVar57 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_06[uVar36 + 0x13] = auVar60[0x12];
                }
                auVar57 = vpackssdw_avx(auVar61._16_16_,auVar61._16_16_);
                auVar57 = vpackssdw_avx(auVar57 ^ auVar54,auVar57 ^ auVar54);
                auVar57 = vpacksswb_avx(auVar57,auVar57);
                if ((auVar57 >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_06[uVar36 + 0x14] = auVar60[0x13];
                }
                auVar49 = vpor_avx2(auVar73,_DAT_00908f60);
                auVar57 = vpcmpgtq_avx(auVar49._0_16_ ^ auVar86,auVar86 ^ auVar45);
                auVar57 = vpackssdw_avx(auVar57,auVar57);
                auVar61 = vpermq_avx2(ZEXT1632(auVar57 ^ auVar54),0x55);
                auVar61 = vpackssdw_avx2(auVar61,auVar50);
                auVar78._0_2_ = auVar61._16_2_;
                auVar78._2_2_ = auVar78._0_2_;
                auVar78._4_2_ = auVar78._0_2_;
                auVar78._6_2_ = auVar78._0_2_;
                auVar78._8_2_ = auVar78._0_2_;
                auVar78._10_2_ = auVar78._0_2_;
                auVar78._12_2_ = auVar78._0_2_;
                auVar78._14_2_ = auVar78._0_2_;
                auVar57 = vpacksswb_avx(auVar78,auVar78);
                if ((auVar57 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_06[uVar36 + 0x15] = auVar60[0x14];
                }
                auVar57 = vpcmpgtq_avx(auVar49._0_16_ ^ auVar86,auVar86 ^ auVar45);
                auVar57 = vpshufhw_avx(auVar57,0x84);
                auVar61 = vpermq_avx2(ZEXT1632(auVar57 ^ auVar54),0x55);
                auVar61 = vpackssdw_avx2(auVar61,auVar50);
                auVar79._0_4_ = auVar61._16_4_;
                auVar79._4_4_ = auVar79._0_4_;
                auVar79._8_4_ = auVar79._0_4_;
                auVar79._12_4_ = auVar79._0_4_;
                auVar57 = vpacksswb_avx(auVar79,auVar79);
                if ((auVar57 >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_06[uVar36 + 0x16] = auVar60[0x15];
                }
                auVar49 = vpcmpgtq_avx2(auVar49 ^ auVar82,auVar55);
                auVar61 = vpackssdw_avx2(auVar50,auVar49);
                auVar57 = auVar61._16_16_ ^ auVar54;
                auVar57 = vpackssdw_avx(auVar57,auVar57);
                auVar57 = vpacksswb_avx(auVar57,auVar57);
                if ((auVar57 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_06[uVar36 + 0x17] = auVar60[0x16];
                }
                auVar61 = vpshufhw_avx2(auVar49,0x84);
                auVar57 = auVar61._16_16_ ^ auVar54;
                auVar57 = vpackssdw_avx(auVar57,auVar57);
                auVar57 = vpacksswb_avx(auVar57,auVar57);
                if ((auVar57 >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_06[uVar36 + 0x18] = auVar60[0x17];
                }
                auVar49 = vpor_avx2(auVar73,_DAT_00908f40);
                auVar57 = vpcmpgtq_avx(auVar49._0_16_ ^ auVar86,auVar86 ^ auVar45);
                auVar57 = vpackssdw_avx(auVar57,auVar57);
                auVar57 = vpackssdw_avx(auVar57 ^ auVar54,auVar57 ^ auVar54);
                auVar61 = vpmovzxwd_avx2(auVar57);
                auVar61 = vpacksswb_avx2(auVar50,auVar61);
                if ((auVar61 & (undefined1  [32])0x1) != (undefined1  [32])0x0) {
                  ptr_06[uVar36 + 0x19] = auVar60[0x10];
                }
                auVar57 = vpcmpgtq_avx(auVar49._0_16_ ^ auVar86,auVar86 ^ auVar45);
                auVar57 = vpackssdw_avx(auVar57,auVar57);
                auVar57 = vpackssdw_avx(auVar57 ^ auVar54,auVar57 ^ auVar54);
                auVar61 = vpermq_avx2(ZEXT1632(auVar57),0x55);
                auVar61 = vpacksswb_avx2(auVar50,auVar61);
                if ((auVar61._16_16_ >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_06[uVar36 + 0x1a] = auVar60[0x11];
                }
                auVar49 = vpcmpgtq_avx2(auVar49 ^ auVar82,auVar55);
                auVar61 = vpshuflw_avx2(auVar49,0xe8);
                auVar61 = vpermd_avx2(auVar56,auVar61 ^ auVar48);
                auVar57 = vpackssdw_avx(auVar61._0_16_,auVar61._0_16_);
                auVar61 = vpermq_avx2(ZEXT1632(auVar57),0x55);
                auVar61 = vpacksswb_avx2(auVar50,auVar61);
                if ((auVar61._16_16_ >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_06[uVar36 + 0x1b] = auVar60[0x12];
                }
                auVar57 = vpackssdw_avx(auVar49._16_16_,auVar49._16_16_);
                auVar57 = vpackssdw_avx(auVar57 ^ auVar54,auVar57 ^ auVar54);
                auVar61 = vpermq_avx2(ZEXT1632(auVar57),0x55);
                auVar61 = vpacksswb_avx2(auVar50,auVar61);
                if ((auVar61._16_16_ >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_06[uVar36 + 0x1c] = auVar60[0x13];
                }
                auVar49 = vpor_avx2(auVar73,_DAT_00908f20);
                auVar57 = vpcmpgtq_avx(auVar86 ^ auVar49._0_16_,auVar86 ^ auVar45);
                auVar57 = vpackssdw_avx(auVar57,auVar57);
                auVar61 = vpermq_avx2(ZEXT1632(auVar57 ^ auVar54),0x55);
                auVar61 = vpackssdw_avx2(auVar50,auVar61);
                auVar61 = vpacksswb_avx2(auVar50,auVar61);
                if ((auVar61._16_16_ >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_06[uVar36 + 0x1d] = auVar60[0x14];
                }
                auVar57 = vpcmpgtq_avx(auVar86 ^ auVar49._0_16_,auVar86 ^ auVar45);
                auVar57 = vpshufhw_avx(auVar57,0x84);
                auVar61 = vpermq_avx2(ZEXT1632(auVar57 ^ auVar54),0x55);
                auVar61 = vpackssdw_avx2(auVar50,auVar61);
                auVar61 = vpacksswb_avx2(auVar50,auVar61);
                if ((auVar61._16_16_ >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_06[uVar36 + 0x1e] = auVar60[0x15];
                }
                auVar49 = vpcmpgtq_avx2(auVar82 ^ auVar49,auVar55);
                auVar61 = vpackssdw_avx2(auVar50,auVar49);
                auVar61 = vpackssdw_avx2(auVar50,auVar61 ^ auVar48);
                auVar61 = vpacksswb_avx2(auVar50,auVar61);
                if ((auVar61._16_16_ >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_06[uVar36 + 0x1f] = auVar60[0x16];
                }
                auVar61 = vpshufhw_avx2(auVar49,0x84);
                auVar61 = vpackssdw_avx2(auVar50,auVar48 ^ auVar61);
                auVar61 = vpacksswb_avx2(auVar50,auVar61);
                if ((auVar61._16_16_ >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_06[uVar36 + 0x20] = auVar60[0x17];
                }
                uVar36 = uVar36 + 0x20;
                auVar62 = vpaddd_avx2(auVar66,auVar62);
                auVar17 = vpaddd_avx2(auVar66,auVar17);
                auVar14 = vpaddd_avx2(auVar66,auVar14);
                auVar47 = vpaddd_avx2(auVar66,auVar47);
              } while ((s2Len + 0x1fU & 0xffffffe0) != uVar36);
              auVar70[8] = 1;
              auVar70._0_8_ = 0x101010101010101;
              auVar70[9] = 1;
              auVar70[10] = 1;
              auVar70[0xb] = 1;
              auVar70[0xc] = 1;
              auVar70[0xd] = 1;
              auVar70[0xe] = 1;
              auVar70[0xf] = 1;
              auVar70[0x10] = 1;
              auVar70[0x11] = 1;
              auVar70[0x12] = 1;
              auVar70[0x13] = 1;
              auVar70[0x14] = 1;
              auVar70[0x15] = 1;
              auVar70[0x16] = 1;
              auVar70[0x17] = 1;
              auVar70[0x18] = 1;
              auVar70[0x19] = 1;
              auVar70[0x1a] = 1;
              auVar70[0x1b] = 1;
              auVar70[0x1c] = 1;
              auVar70[0x1d] = 1;
              auVar70[0x1e] = 1;
              auVar70[0x1f] = 1;
              lVar26 = CONCAT44(uVar90,uVar89) << 5;
              auVar62 = vpcmpeqb_avx2(local_198,_DAT_00909020);
              local_238[1] = bVar20;
              local_238[0] = bVar20;
              local_238[2] = bVar20;
              local_238[3] = bVar20;
              local_238[4] = bVar20;
              local_238[5] = bVar20;
              local_238[6] = bVar20;
              local_238[7] = bVar20;
              local_238[8] = bVar20;
              local_238[9] = bVar20;
              local_238[10] = bVar20;
              local_238[0xb] = bVar20;
              local_238[0xc] = bVar20;
              local_238[0xd] = bVar20;
              local_238[0xe] = bVar20;
              local_238[0xf] = bVar20;
              local_238[0x10] = bVar20;
              local_238[0x11] = bVar20;
              local_238[0x12] = bVar20;
              local_238[0x13] = bVar20;
              local_238[0x14] = bVar20;
              local_238[0x15] = bVar20;
              local_238[0x16] = bVar20;
              local_238[0x17] = bVar20;
              local_238[0x18] = bVar20;
              local_238[0x19] = bVar20;
              local_238[0x1a] = bVar20;
              local_238[0x1b] = bVar20;
              local_238[0x1c] = bVar20;
              local_238[0x1d] = bVar20;
              local_238[0x1e] = bVar20;
              local_238[0x1f] = bVar20;
              auVar64 = ZEXT3264(local_238);
              auVar67 = ZEXT3264(local_238);
              auVar69 = ZEXT3264(local_238);
              auVar71 = ZEXT3264(local_238);
              auVar88 = ZEXT3264(CONCAT131(cVar19,CONCAT130(cVar19,CONCAT129(cVar19,CONCAT128(cVar19
                                                  ,CONCAT127(cVar19,CONCAT126(cVar19,CONCAT125(
                                                  cVar19,CONCAT124(cVar19,CONCAT123(cVar19,CONCAT122
                                                  (cVar19,CONCAT121(cVar19,CONCAT120(cVar19,
                                                  CONCAT119(cVar19,CONCAT118(cVar19,CONCAT117(cVar19
                                                  ,CONCAT116(cVar19,CONCAT115(cVar19,CONCAT114(
                                                  cVar19,CONCAT113(cVar19,CONCAT112(cVar19,CONCAT111
                                                  (cVar19,CONCAT110(cVar19,CONCAT19(cVar19,CONCAT18(
                                                  cVar19,CONCAT17(cVar19,CONCAT16(cVar19,CONCAT15(
                                                  cVar19,CONCAT14(cVar19,CONCAT13(cVar19,CONCAT12(
                                                  cVar19,CONCAT11(cVar19,cVar19)))))))))))))))))))))
                                                  )))))))))));
              uVar36 = 0;
              iVar37 = iVar22;
              do {
                alVar13 = b_03[uVar40];
                alVar2 = b_04[uVar40];
                alVar3 = b_05[uVar40];
                auVar54 = SUB3216(ptr[uVar40],0);
                auVar74._0_16_ = ZEXT116(0) * auVar54 + ZEXT116(1) * alVar13._0_16_;
                auVar74._16_16_ = ZEXT116(0) * alVar13._16_16_ + ZEXT116(1) * auVar54;
                auVar17 = vpalignr_avx2((undefined1  [32])ptr[uVar40],auVar74,0xf);
                auVar14 = vperm2i128_avx2((undefined1  [32])alVar13,(undefined1  [32])alVar13,0x28);
                auVar14 = vpalignr_avx2((undefined1  [32])alVar13,auVar14,0xf);
                auVar47 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2,0x28);
                auVar47 = vpalignr_avx2((undefined1  [32])alVar2,auVar47,0xf);
                auVar48 = vperm2i128_avx2((undefined1  [32])alVar3,(undefined1  [32])alVar3,0x28);
                auVar54 = vpinsrb_avx(auVar17._0_16_,(uint)(byte)ptr_06[uVar36],0);
                auVar48 = vpalignr_avx2((undefined1  [32])alVar3,auVar48,0xf);
                auVar17 = vpblendd_avx2(auVar17,ZEXT1632(auVar54),0xf);
                lVar38 = (long)ppVar7->mapper[(byte)s2[uVar36]] * CONCAT44(0,uVar89) * 0x20;
                auVar68[1] = bVar20;
                auVar68[0] = bVar20;
                auVar68[2] = bVar20;
                auVar68[3] = bVar20;
                auVar68[4] = bVar20;
                auVar68[5] = bVar20;
                auVar68[6] = bVar20;
                auVar68[7] = bVar20;
                auVar68[8] = bVar20;
                auVar68[9] = bVar20;
                auVar68[10] = bVar20;
                auVar68[0xb] = bVar20;
                auVar68[0xc] = bVar20;
                auVar68[0xd] = bVar20;
                auVar68[0xe] = bVar20;
                auVar68[0xf] = bVar20;
                auVar68[0x10] = bVar20;
                auVar68[0x11] = bVar20;
                auVar68[0x12] = bVar20;
                auVar68[0x13] = bVar20;
                auVar68[0x14] = bVar20;
                auVar68[0x15] = bVar20;
                auVar68[0x16] = bVar20;
                auVar68[0x17] = bVar20;
                auVar68[0x18] = bVar20;
                auVar68[0x19] = bVar20;
                auVar68[0x1a] = bVar20;
                auVar68[0x1b] = bVar20;
                auVar68[0x1c] = bVar20;
                auVar68[0x1d] = bVar20;
                auVar68[0x1e] = bVar20;
                auVar68[0x1f] = bVar20;
                auVar56 = vpsubsb_avx2(auVar68,(undefined1  [32])*ptr_04);
                auVar84 = ZEXT1664((undefined1  [16])0x0);
                lVar32 = 0;
                auVar83 = ZEXT1664((undefined1  [16])0x0);
                auVar75 = ZEXT1664((undefined1  [16])0x0);
                do {
                  auVar50 = vpaddsb_avx2(auVar17,*(undefined1 (*) [32])
                                                  ((long)pvVar6 + lVar32 + lVar38));
                  auVar82 = vpaddsb_avx2(auVar14,*(undefined1 (*) [32])
                                                  ((long)pvVar8 + lVar32 + lVar38));
                  auVar17 = *(undefined1 (*) [32])((long)*ptr + lVar32);
                  auVar14 = *(undefined1 (*) [32])((long)*b_03 + lVar32);
                  auVar61 = vpaddsb_avx2(auVar47,*(undefined1 (*) [32])
                                                  ((long)pvVar9 + lVar32 + lVar38));
                  auVar47 = *(undefined1 (*) [32])((long)*b_04 + lVar32);
                  auVar56 = vpaddsb_avx2(auVar56,*(undefined1 (*) [32])((long)*ptr_04 + lVar32));
                  auVar49 = vpaddsb_avx2(auVar70,auVar48);
                  auVar48 = *(undefined1 (*) [32])((long)*b_05 + lVar32);
                  auVar81 = vpcmpgtb_avx2(auVar56,auVar68);
                  auVar85 = vpblendvb_avx2(auVar75._0_32_,local_318,auVar81);
                  auVar80 = vpblendvb_avx2(auVar83._0_32_,local_2f8,auVar81);
                  auVar55 = vpaddsb_avx2(local_2d8,*(undefined1 (*) [32])((long)*ptr_05 + lVar32));
                  auVar81 = vpblendvb_avx2(auVar84._0_32_,auVar55,auVar81);
                  auVar15[1] = uVar42;
                  auVar15[0] = uVar42;
                  auVar15[2] = uVar42;
                  auVar15[3] = uVar42;
                  auVar15[4] = uVar42;
                  auVar15[5] = uVar42;
                  auVar15[6] = uVar42;
                  auVar15[7] = uVar42;
                  auVar15[8] = uVar42;
                  auVar15[9] = uVar42;
                  auVar15[10] = uVar42;
                  auVar15[0xb] = uVar42;
                  auVar15[0xc] = uVar42;
                  auVar15[0xd] = uVar42;
                  auVar15[0xe] = uVar42;
                  auVar15[0xf] = uVar42;
                  auVar15[0x10] = uVar42;
                  auVar15[0x11] = uVar42;
                  auVar15[0x12] = uVar42;
                  auVar15[0x13] = uVar42;
                  auVar15[0x14] = uVar42;
                  auVar15[0x15] = uVar42;
                  auVar15[0x16] = uVar42;
                  auVar15[0x17] = uVar42;
                  auVar15[0x18] = uVar42;
                  auVar15[0x19] = uVar42;
                  auVar15[0x1a] = uVar42;
                  auVar15[0x1b] = uVar42;
                  auVar15[0x1c] = uVar42;
                  auVar15[0x1d] = uVar42;
                  auVar15[0x1e] = uVar42;
                  auVar15[0x1f] = uVar42;
                  auVar66 = vpsubsb_avx2(auVar17,auVar15);
                  auVar87[1] = cVar43;
                  auVar87[0] = cVar43;
                  auVar87[2] = cVar43;
                  auVar87[3] = cVar43;
                  auVar87[4] = cVar43;
                  auVar87[5] = cVar43;
                  auVar87[6] = cVar43;
                  auVar87[7] = cVar43;
                  auVar87[8] = cVar43;
                  auVar87[9] = cVar43;
                  auVar87[10] = cVar43;
                  auVar87[0xb] = cVar43;
                  auVar87[0xc] = cVar43;
                  auVar87[0xd] = cVar43;
                  auVar87[0xe] = cVar43;
                  auVar87[0xf] = cVar43;
                  auVar87[0x10] = cVar43;
                  auVar87[0x11] = cVar43;
                  auVar87[0x12] = cVar43;
                  auVar87[0x13] = cVar43;
                  auVar87[0x14] = cVar43;
                  auVar87[0x15] = cVar43;
                  auVar87[0x16] = cVar43;
                  auVar87[0x17] = cVar43;
                  auVar87[0x18] = cVar43;
                  auVar87[0x19] = cVar43;
                  auVar87[0x1a] = cVar43;
                  auVar87[0x1b] = cVar43;
                  auVar87[0x1c] = cVar43;
                  auVar87[0x1d] = cVar43;
                  auVar87[0x1e] = cVar43;
                  auVar87[0x1f] = cVar43;
                  auVar73 = vpsubsb_avx2(*(undefined1 (*) [32])((long)*b + lVar32),auVar87);
                  auVar55 = vpcmpgtb_avx2(auVar66,auVar73);
                  auVar87 = vpmaxsb_avx2(auVar66,auVar73);
                  auVar66 = vpblendvb_avx2(*(undefined1 (*) [32])((long)*b_00 + lVar32),auVar14,
                                           auVar55);
                  auVar73 = vpblendvb_avx2(*(undefined1 (*) [32])((long)*b_01 + lVar32),auVar47,
                                           auVar55);
                  auVar55 = vpblendvb_avx2(*(undefined1 (*) [32])((long)*b_02 + lVar32),auVar48,
                                           auVar55);
                  auVar55 = vpaddsb_avx2(auVar55,auVar70);
                  auVar74 = vpcmpgtb_avx2(auVar87,auVar50);
                  *(undefined1 (*) [32])((long)*b + lVar32) = auVar87;
                  *(undefined1 (*) [32])((long)*b_00 + lVar32) = auVar66;
                  local_318 = vpblendvb_avx2(auVar82,auVar66,auVar74);
                  *(undefined1 (*) [32])((long)*b_01 + lVar32) = auVar73;
                  local_2f8 = vpblendvb_avx2(auVar61,auVar73,auVar74);
                  auVar75 = ZEXT3264(auVar85);
                  local_2d8 = vpblendvb_avx2(auVar49,auVar55,auVar74);
                  *(undefined1 (*) [32])((long)*b_02 + lVar32) = auVar55;
                  auVar84 = ZEXT3264(auVar81);
                  auVar68 = vpmaxsb_avx2(auVar68,auVar56);
                  auVar56 = vpmaxsb_avx2(auVar87,auVar50);
                  auVar83 = ZEXT3264(auVar80);
                  *(undefined1 (*) [32])((long)*ptr + lVar32) = auVar50;
                  *(undefined1 (*) [32])((long)*b_03 + lVar32) = auVar82;
                  *(undefined1 (*) [32])((long)*b_04 + lVar32) = auVar61;
                  *(undefined1 (*) [32])((long)*b_05 + lVar32) = auVar49;
                  lVar32 = lVar32 + 0x20;
                } while (lVar26 != lVar32);
                auVar51._0_16_ = ZEXT116(0) * auVar56._0_16_ + ZEXT116(1) * auVar17._0_16_;
                auVar51._16_16_ = ZEXT116(0) * auVar17._16_16_ + ZEXT116(1) * auVar56._0_16_;
                auVar17 = vpalignr_avx2(auVar56,auVar51,0xf);
                auVar14 = vperm2i128_avx2(local_318,local_318,8);
                local_318 = vpalignr_avx2(local_318,auVar14,0xf);
                auVar14 = vperm2i128_avx2(local_2f8,local_2f8,8);
                local_2f8 = vpalignr_avx2(local_2f8,auVar14,0xf);
                auVar14 = vperm2i128_avx2(local_2d8,local_2d8,8);
                auVar54 = vpinsrb_avx(auVar17._0_16_,(uint)(byte)ptr_06[uVar36 + 1],0);
                local_2d8 = vpalignr_avx2(local_2d8,auVar14,0xf);
                auVar50 = vpblendd_avx2(auVar17,ZEXT1632(auVar54),0xf);
                auVar17 = vpaddsb_avx2(auVar50,(undefined1  [32])*ptr_04);
                auVar48 = vpcmpgtb_avx2(auVar68,auVar17);
                auVar56 = vpmaxsb_avx2(auVar68,auVar17);
                auVar47 = vpblendvb_avx2(local_318,auVar85,auVar48);
                auVar14 = vpblendvb_avx2(local_2f8,auVar80,auVar48);
                auVar17 = vpaddsb_avx2(local_2d8,(undefined1  [32])*ptr_05);
                uVar1 = uVar36 + 1;
                auVar17 = vpblendvb_avx2(auVar17,auVar81,auVar48);
                iVar30 = 0x1e;
                do {
                  auVar82 = vperm2i128_avx2(auVar17,auVar17,0x28);
                  auVar49 = vperm2i128_avx2(auVar14,auVar14,0x28);
                  auVar61 = vperm2i128_avx2(auVar47,auVar47,0x28);
                  auVar48 = vperm2i128_avx2(auVar56,auVar56,0x28);
                  auVar48 = vpalignr_avx2(auVar56,auVar48,0xf);
                  auVar48 = vpaddsb_avx2(auVar46,auVar48);
                  auVar61 = vpalignr_avx2(auVar47,auVar61,0xf);
                  auVar49 = vpalignr_avx2(auVar14,auVar49,0xf);
                  auVar82 = vpalignr_avx2(auVar17,auVar82,0xf);
                  auVar82 = vpaddsb_avx2(auVar12,auVar82);
                  auVar55 = vpcmpgtb_avx2(auVar56,auVar48);
                  auVar47 = vpblendvb_avx2(auVar61,auVar47,auVar55);
                  auVar14 = vpblendvb_avx2(auVar49,auVar14,auVar55);
                  auVar56 = vpmaxsb_avx2(auVar56,auVar48);
                  auVar17 = vpblendvb_avx2(auVar82,auVar17,auVar55);
                  iVar30 = iVar30 + -1;
                } while (iVar30 != 0);
                auVar48 = vperm2i128_avx2(auVar56,auVar56,0x28);
                auVar48 = vpalignr_avx2(auVar56,auVar48,0xf);
                auVar56 = vperm2i128_avx2(auVar47,auVar47,0x28);
                auVar47 = vpalignr_avx2(auVar47,auVar56,0xf);
                auVar56 = vperm2i128_avx2(auVar14,auVar14,0x28);
                auVar56 = vpalignr_avx2(auVar14,auVar56,0xf);
                auVar14 = vperm2i128_avx2(auVar17,auVar17,0x28);
                auVar14 = vpalignr_avx2(auVar17,auVar14,0xf);
                auVar17 = vpaddsb_avx2(auVar48,ZEXT132(bVar20));
                auVar48 = vpcmpgtb_avx2(auVar17,auVar50);
                auVar61 = vpblendvb_avx2(local_318,auVar47,auVar48);
                auVar82 = vpblendvb_avx2(local_2f8,auVar56,auVar48);
                auVar50 = vpmaxsb_avx2(auVar17,auVar50);
                auVar48 = vpblendvb_avx2(local_2d8,auVar14,auVar48);
                lVar32 = 0;
                auVar16[1] = uVar42;
                auVar16[0] = uVar42;
                auVar16[2] = uVar42;
                auVar16[3] = uVar42;
                auVar16[4] = uVar42;
                auVar16[5] = uVar42;
                auVar16[6] = uVar42;
                auVar16[7] = uVar42;
                auVar16[8] = uVar42;
                auVar16[9] = uVar42;
                auVar16[10] = uVar42;
                auVar16[0xb] = uVar42;
                auVar16[0xc] = uVar42;
                auVar16[0xd] = uVar42;
                auVar16[0xe] = uVar42;
                auVar16[0xf] = uVar42;
                auVar16[0x10] = uVar42;
                auVar16[0x11] = uVar42;
                auVar16[0x12] = uVar42;
                auVar16[0x13] = uVar42;
                auVar16[0x14] = uVar42;
                auVar16[0x15] = uVar42;
                auVar16[0x16] = uVar42;
                auVar16[0x17] = uVar42;
                auVar16[0x18] = uVar42;
                auVar16[0x19] = uVar42;
                auVar16[0x1a] = uVar42;
                auVar16[0x1b] = uVar42;
                auVar16[0x1c] = uVar42;
                auVar16[0x1d] = uVar42;
                auVar16[0x1e] = uVar42;
                auVar16[0x1f] = uVar42;
                auVar11[1] = cVar43;
                auVar11[0] = cVar43;
                auVar11[2] = cVar43;
                auVar11[3] = cVar43;
                auVar11[4] = cVar43;
                auVar11[5] = cVar43;
                auVar11[6] = cVar43;
                auVar11[7] = cVar43;
                auVar11[8] = cVar43;
                auVar11[9] = cVar43;
                auVar11[10] = cVar43;
                auVar11[0xb] = cVar43;
                auVar11[0xc] = cVar43;
                auVar11[0xd] = cVar43;
                auVar11[0xe] = cVar43;
                auVar11[0xf] = cVar43;
                auVar11[0x10] = cVar43;
                auVar11[0x11] = cVar43;
                auVar11[0x12] = cVar43;
                auVar11[0x13] = cVar43;
                auVar11[0x14] = cVar43;
                auVar11[0x15] = cVar43;
                auVar11[0x16] = cVar43;
                auVar11[0x17] = cVar43;
                auVar11[0x18] = cVar43;
                auVar11[0x19] = cVar43;
                auVar11[0x1a] = cVar43;
                auVar11[0x1b] = cVar43;
                auVar11[0x1c] = cVar43;
                auVar11[0x1d] = cVar43;
                auVar11[0x1e] = cVar43;
                auVar11[0x1f] = cVar43;
                auVar88 = ZEXT3264(auVar88._0_32_);
                do {
                  auVar49 = *(undefined1 (*) [32])((long)*ptr + lVar32);
                  auVar50 = vpsubsb_avx2(auVar50,auVar16);
                  auVar55 = vpsubsb_avx2(auVar17,auVar11);
                  auVar17 = vpcmpgtb_avx2(auVar50,auVar55);
                  auVar47 = vpblendvb_avx2(auVar47,auVar61,auVar17);
                  auVar56 = vpblendvb_avx2(auVar56,auVar82,auVar17);
                  auVar14 = vpblendvb_avx2(auVar14,auVar48,auVar17);
                  auVar17 = vpmaxsb_avx2(auVar50,auVar55);
                  auVar48 = vpmaxsb_avx2(auVar49,*(undefined1 (*) [32])((long)*b + lVar32));
                  auVar50 = vpmaxsb_avx2(auVar48,auVar17);
                  auVar55 = vpcmpgtb_avx2(auVar48,auVar17);
                  auVar48 = vpblendvb_avx2(auVar47,*(undefined1 (*) [32])((long)*b_00 + lVar32),
                                           auVar55);
                  auVar49 = vpcmpeqb_avx2(auVar50,auVar49);
                  auVar61 = vpblendvb_avx2(auVar48,*(undefined1 (*) [32])((long)*b_03 + lVar32),
                                           auVar49);
                  auVar48 = vpblendvb_avx2(auVar56,*(undefined1 (*) [32])((long)*b_01 + lVar32),
                                           auVar55);
                  auVar82 = vpblendvb_avx2(auVar48,*(undefined1 (*) [32])((long)*b_04 + lVar32),
                                           auVar49);
                  auVar14 = vpaddsb_avx2(auVar14,auVar70);
                  auVar48 = vpblendvb_avx2(auVar14,*(undefined1 (*) [32])((long)*b_02 + lVar32),
                                           auVar55);
                  auVar48 = vpblendvb_avx2(auVar48,*(undefined1 (*) [32])((long)*b_05 + lVar32),
                                           auVar49);
                  *(undefined1 (*) [32])((long)*ptr + lVar32) = auVar50;
                  *(undefined1 (*) [32])((long)*b_03 + lVar32) = auVar61;
                  *(undefined1 (*) [32])((long)*b_04 + lVar32) = auVar82;
                  *(undefined1 (*) [32])((long)*b_05 + lVar32) = auVar48;
                  auVar85 = vpminsb_avx2(auVar88._0_32_,auVar50);
                  auVar88 = ZEXT3264(auVar85);
                  auVar49 = vpmaxsb_avx2(local_238,auVar50);
                  auVar49 = vpmaxsb_avx2(auVar49,auVar61);
                  auVar55 = vpmaxsb_avx2(auVar82,auVar48);
                  local_238 = vpmaxsb_avx2(auVar49,auVar55);
                  lVar32 = lVar32 + 0x20;
                } while (lVar26 != lVar32);
                auVar14 = vpcmpgtb_avx2((undefined1  [32])ptr[uVar10],auVar71._0_32_);
                auVar17 = vpblendvb_avx2(auVar69._0_32_,(undefined1  [32])b_03[uVar10],auVar14);
                cVar21 = auVar17[0x17];
                auVar69 = ZEXT3264(auVar17);
                auVar17 = vpblendvb_avx2(auVar67._0_32_,(undefined1  [32])b_04[uVar10],auVar14);
                cVar27 = auVar17[0x17];
                auVar67 = ZEXT3264(auVar17);
                auVar17 = vpblendvb_avx2(auVar64._0_32_,(undefined1  [32])b_05[uVar10],auVar14);
                cVar33 = auVar17[0x17];
                auVar64 = ZEXT3264(auVar17);
                auVar17 = vpmaxsb_avx2(auVar71._0_32_,(undefined1  [32])ptr[uVar10]);
                bVar72 = auVar17[0x17];
                auVar71 = ZEXT3264(auVar17);
                auVar17 = vpand_avx2(auVar14,auVar62);
                if ((((((((((((((((((((((((((((((((auVar17 >> 7 & (undefined1  [32])0x1) !=
                                                  (undefined1  [32])0x0 ||
                                                 (auVar17 >> 0xf & (undefined1  [32])0x1) !=
                                                 (undefined1  [32])0x0) ||
                                                (auVar17 >> 0x17 & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0) ||
                                               (auVar17 >> 0x1f & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar17 >> 0x27 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             (auVar17 >> 0x2f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar17 >> 0x37 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar17 >> 0x3f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar17 >> 0x47 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar17 >> 0x4f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar17 >> 0x57 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar17 >> 0x5f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar17 >> 0x67 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar17 >> 0x6f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar17 >> 0x77 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar17 >> 0x7f,0) != '\0') ||
                                  (auVar17 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar17 >> 0x8f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar17 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar17 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar17 >> 0xa7 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                             (auVar17 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar17 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar17 >> 0xbf,0) != '\0') ||
                          (auVar17 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar17 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar17 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar17 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar17 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar17 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar17 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    auVar17[0x1f] < '\0') {
                  iVar37 = (int)uVar36;
                }
                uVar36 = uVar1;
              } while (uVar1 != (uint)s2Len);
              if (s2_end == 0) {
                cVar21 = '\0';
                cVar27 = '\0';
                cVar33 = '\0';
              }
              else {
                if (iVar24 < 0x1f) {
                  iVar30 = 0;
                  do {
                    auVar62 = auVar71._0_32_;
                    auVar46 = vperm2i128_avx2(auVar62,auVar62,8);
                    auVar46 = vpalignr_avx2(auVar62,auVar46,0xf);
                    bVar72 = auVar46[0x17];
                    auVar71 = ZEXT3264(auVar46);
                    auVar62 = auVar69._0_32_;
                    auVar46 = vperm2i128_avx2(auVar62,auVar62,8);
                    auVar46 = vpalignr_avx2(auVar62,auVar46,0xf);
                    cVar21 = auVar46[0x17];
                    auVar69 = ZEXT3264(auVar46);
                    auVar62 = auVar67._0_32_;
                    auVar46 = vperm2i128_avx2(auVar62,auVar62,8);
                    auVar46 = vpalignr_avx2(auVar62,auVar46,0xf);
                    cVar27 = auVar46[0x17];
                    auVar67 = ZEXT3264(auVar46);
                    auVar62 = auVar64._0_32_;
                    auVar46 = vperm2i128_avx2(auVar62,auVar62,8);
                    auVar46 = vpalignr_avx2(auVar62,auVar46,0xf);
                    cVar33 = auVar46[0x17];
                    auVar64 = ZEXT3264(auVar46);
                    iVar30 = iVar30 + 1;
                  } while (iVar30 < iVar28);
                }
                uVar23 = (uint)bVar72;
              }
              cVar43 = (char)uVar23;
              uVar35 = uVar34;
              if ((s1_end != 0) && (((ulong)uVar5 + 0x1f & 0x7fffffe0) != 0)) {
                uVar40 = 0;
                do {
                  uVar39 = ((uint)uVar40 & 0x1f) * uVar89 + ((uint)(uVar40 >> 5) & 0x7ffffff);
                  uVar29 = uVar23;
                  if ((int)uVar39 < (int)uVar5) {
                    bVar72 = *(byte *)((long)*ptr + uVar40);
                    uVar29 = (uint)bVar72;
                    if (((char)(byte)uVar23 < (char)bVar72) ||
                       (((uVar29 = uVar23, bVar72 == (byte)uVar23 && (iVar37 == iVar22)) &&
                        ((int)uVar39 < (int)uVar35)))) {
                      cVar21 = *(char *)((long)*b_03 + uVar40);
                      cVar27 = *(char *)((long)*b_04 + uVar40);
                      cVar33 = *(char *)((long)*b_05 + uVar40);
                      iVar37 = iVar22;
                      uVar35 = uVar39;
                    }
                  }
                  cVar43 = (char)uVar29;
                  uVar40 = uVar40 + 1;
                  uVar23 = uVar29;
                } while ((uVar89 & 0x3ffffff) << 5 != (int)uVar40);
              }
              if (s2_end == 0 && s1_end == 0) {
                alVar13 = ptr[uVar10];
                cVar43 = alVar13[2]._7_1_;
                alVar2 = b_03[uVar10];
                cVar21 = alVar2[2]._7_1_;
                alVar3 = b_04[uVar10];
                cVar27 = alVar3[2]._7_1_;
                alVar4 = b_05[uVar10];
                cVar33 = alVar4[2]._7_1_;
                uVar35 = uVar34;
                iVar37 = iVar22;
                if (iVar24 < 0x1f) {
                  iVar24 = 0;
                  do {
                    auVar46 = vperm2i128_avx2((undefined1  [32])alVar13,(undefined1  [32])alVar13,
                                              0x28);
                    alVar13 = (__m256i)vpalignr_avx2((undefined1  [32])alVar13,auVar46,0xf);
                    cVar43 = alVar13[2]._7_1_;
                    auVar46 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2,0x28
                                             );
                    alVar2 = (__m256i)vpalignr_avx2((undefined1  [32])alVar2,auVar46,0xf);
                    cVar21 = alVar2[2]._7_1_;
                    auVar46 = vperm2i128_avx2((undefined1  [32])alVar3,(undefined1  [32])alVar3,0x28
                                             );
                    alVar3 = (__m256i)vpalignr_avx2((undefined1  [32])alVar3,auVar46,0xf);
                    cVar27 = alVar3[2]._7_1_;
                    auVar46 = vperm2i128_avx2((undefined1  [32])alVar4,(undefined1  [32])alVar4,0x28
                                             );
                    alVar4 = (__m256i)vpalignr_avx2((undefined1  [32])alVar4,auVar46,0xf);
                    cVar33 = alVar4[2]._7_1_;
                    iVar24 = iVar24 + 1;
                  } while (iVar24 < iVar28);
                }
              }
              auVar12[1] = bVar20;
              auVar12[0] = bVar20;
              auVar12[2] = bVar20;
              auVar12[3] = bVar20;
              auVar12[4] = bVar20;
              auVar12[5] = bVar20;
              auVar12[6] = bVar20;
              auVar12[7] = bVar20;
              auVar12[8] = bVar20;
              auVar12[9] = bVar20;
              auVar12[10] = bVar20;
              auVar12[0xb] = bVar20;
              auVar12[0xc] = bVar20;
              auVar12[0xd] = bVar20;
              auVar12[0xe] = bVar20;
              auVar12[0xf] = bVar20;
              auVar12[0x10] = bVar20;
              auVar12[0x11] = bVar20;
              auVar12[0x12] = bVar20;
              auVar12[0x13] = bVar20;
              auVar12[0x14] = bVar20;
              auVar12[0x15] = bVar20;
              auVar12[0x16] = bVar20;
              auVar12[0x17] = bVar20;
              auVar12[0x18] = bVar20;
              auVar12[0x19] = bVar20;
              auVar12[0x1a] = bVar20;
              auVar12[0x1b] = bVar20;
              auVar12[0x1c] = bVar20;
              auVar12[0x1d] = bVar20;
              auVar12[0x1e] = bVar20;
              auVar12[0x1f] = bVar20;
              auVar46 = vpcmpgtb_avx2(auVar12,auVar85);
              auVar18[1] = cVar19;
              auVar18[0] = cVar19;
              auVar18[2] = cVar19;
              auVar18[3] = cVar19;
              auVar18[4] = cVar19;
              auVar18[5] = cVar19;
              auVar18[6] = cVar19;
              auVar18[7] = cVar19;
              auVar18[8] = cVar19;
              auVar18[9] = cVar19;
              auVar18[10] = cVar19;
              auVar18[0xb] = cVar19;
              auVar18[0xc] = cVar19;
              auVar18[0xd] = cVar19;
              auVar18[0xe] = cVar19;
              auVar18[0xf] = cVar19;
              auVar18[0x10] = cVar19;
              auVar18[0x11] = cVar19;
              auVar18[0x12] = cVar19;
              auVar18[0x13] = cVar19;
              auVar18[0x14] = cVar19;
              auVar18[0x15] = cVar19;
              auVar18[0x16] = cVar19;
              auVar18[0x17] = cVar19;
              auVar18[0x18] = cVar19;
              auVar18[0x19] = cVar19;
              auVar18[0x1a] = cVar19;
              auVar18[0x1b] = cVar19;
              auVar18[0x1c] = cVar19;
              auVar18[0x1d] = cVar19;
              auVar18[0x1e] = cVar19;
              auVar18[0x1f] = cVar19;
              auVar62 = vpcmpgtb_avx2(local_238,auVar18);
              auVar46 = vpor_avx2(auVar62,auVar46);
              if ((((((((((((((((((((((((((((((((auVar46 >> 7 & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0 ||
                                               (auVar46 >> 0xf & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar46 >> 0x17 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             (auVar46 >> 0x1f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar46 >> 0x27 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar46 >> 0x2f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar46 >> 0x37 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar46 >> 0x3f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar46 >> 0x47 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar46 >> 0x4f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar46 >> 0x57 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar46 >> 0x5f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar46 >> 0x67 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar46 >> 0x6f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar46 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || SUB321(auVar46 >> 0x7f,0) != '\0') ||
                                (auVar46 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar46 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar46 >> 0x97 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                             (auVar46 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar46 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar46 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar46 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar46 >> 0xbf,0) != '\0') ||
                        (auVar46 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar46 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar46 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar46 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar46 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar46 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar46 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  auVar46[0x1f] < '\0') {
                *(byte *)&ppVar25->flag = (byte)ppVar25->flag | 0x40;
                cVar43 = '\0';
                cVar21 = '\0';
                cVar27 = '\0';
                cVar33 = '\0';
                iVar37 = 0;
                uVar35 = 0;
              }
              ppVar25->score = (int)cVar43;
              ppVar25->end_query = uVar35;
              ppVar25->end_ref = iVar37;
              *(int *)(ppVar25->field_4).extra = (int)cVar21;
              ((ppVar25->field_4).stats)->similar = (int)cVar27;
              ((ppVar25->field_4).stats)->length = (int)cVar33;
              parasail_free(ptr_06);
              parasail_free(ptr_05);
              parasail_free(ptr_04);
              parasail_free(ptr_03);
              parasail_free(ptr_02);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(b_05);
              parasail_free(b_04);
              parasail_free(b_03);
              parasail_free(ptr);
              parasail_free(b_02);
              parasail_free(b_01);
              parasail_free(b_00);
              parasail_free(b);
              return ppVar25;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvPm = NULL;
    __m256i* restrict pvPs = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvEM = NULL;
    __m256i* restrict pvES = NULL;
    __m256i* restrict pvEL = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvHM = NULL;
    __m256i* restrict pvHS = NULL;
    __m256i* restrict pvHL = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvHMMax = NULL;
    __m256i* restrict pvHSMax = NULL;
    __m256i* restrict pvHLMax = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i* restrict pvGapperL = NULL;
    int8_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int8_t NEG_LIMIT = 0;
    int8_t POS_LIMIT = 0;
    __m256i vZero;
    __m256i vOne;
    int8_t score = 0;
    int8_t matches = 0;
    int8_t similar = 0;
    int8_t length = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vMaxM;
    __m256i vMaxS;
    __m256i vMaxL;
    __m256i vPosMask;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    __m256i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 32; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m256i*)profile->profile8.score;
    pvPm = (__m256i*)profile->profile8.matches;
    pvPs = (__m256i*)profile->profile8.similar;
    vGapO = _mm256_set1_epi8(open);
    vGapE = _mm256_set1_epi8(gap);
    NEG_LIMIT = (-open < matrix->min ? INT8_MIN + open : INT8_MIN - matrix->min) + 1;
    POS_LIMIT = INT8_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    vOne = _mm256_set1_epi8(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm256_set1_epi8(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi8(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxM = vNegLimit;
    vMaxS = vNegLimit;
    vMaxL = vNegLimit;
    vPosMask = _mm256_cmpeq_epi8(_mm256_set1_epi8(position),
            _mm256_set_epi8(0,1,2,3,4,5,6,7,8,9,10,11,12,13,14,15,16,17,18,19,20,21,22,23,24,25,26,27,28,29,30,31));
    vNegInfFront = vZero;
    vSegLen = _mm256_slli_si256_rpl(_mm256_set1_epi8(segLen), 1);
    vNegInfFront = _mm256_insert_epi8_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_adds_epi8(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi8(-segLen*gap), 1));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_32;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m256i(32, segLen);
    pvEM = parasail_memalign___m256i(32, segLen);
    pvES = parasail_memalign___m256i(32, segLen);
    pvEL = parasail_memalign___m256i(32, segLen);
    pvH  = parasail_memalign___m256i(32, segLen);
    pvHM = parasail_memalign___m256i(32, segLen);
    pvHS = parasail_memalign___m256i(32, segLen);
    pvHL = parasail_memalign___m256i(32, segLen);
    pvHMax  = parasail_memalign___m256i(32, segLen);
    pvHMMax = parasail_memalign___m256i(32, segLen);
    pvHSMax = parasail_memalign___m256i(32, segLen);
    pvHLMax = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);
    pvGapperL = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int8_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m256i(pvHM, vZero, segLen);
    parasail_memset___m256i(pvHS, vZero, segLen);
    parasail_memset___m256i(pvHL, vZero, segLen);
    parasail_memset___m256i(pvE, vNegLimit, segLen);
    parasail_memset___m256i(pvEM, vZero, segLen);
    parasail_memset___m256i(pvES, vZero, segLen);
    parasail_memset___m256i(pvEL, vZero, segLen);
    {
        __m256i vGapper = _mm256_subs_epi8(vZero,vGapO);
        __m256i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            _mm256_store_si256(pvGapperL+i, vGapperL);
            vGapper = _mm256_subs_epi8(vGapper, vGapE);
            vGapperL = _mm256_adds_epi8(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_8_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
            }
            _mm256_store_si256(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT8_MIN ? INT8_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vE_ext;
        __m256i vE_opn;
        __m256i vEM;
        __m256i vES;
        __m256i vEL;
        __m256i vHt;
        __m256i vHtM;
        __m256i vHtS;
        __m256i vHtL;
        __m256i vF;
        __m256i vF_ext;
        __m256i vF_opn;
        __m256i vFM;
        __m256i vFS;
        __m256i vFL;
        __m256i vH;
        __m256i vHM;
        __m256i vHS;
        __m256i vHL;
        __m256i vHp;
        __m256i vHpM;
        __m256i vHpS;
        __m256i vHpL;
        __m256i *pvW;
        __m256i vW;
        __m256i *pvWM;
        __m256i vWM;
        __m256i *pvWS;
        __m256i vWS;
        __m256i case1;
        __m256i case2;
        __m256i vGapper;
        __m256i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHpM = _mm256_load_si256(pvHM+(segLen-1));
        vHpS = _mm256_load_si256(pvHS+(segLen-1));
        vHpL = _mm256_load_si256(pvHL+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 1);
        vHpM = _mm256_slli_si256_rpl(vHpM, 1);
        vHpS = _mm256_slli_si256_rpl(vHpS, 1);
        vHpL = _mm256_slli_si256_rpl(vHpL, 1);
        vHp = _mm256_insert_epi8_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm256_subs_epi8(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vHM= _mm256_load_si256(pvHM+i);
            vHS= _mm256_load_si256(pvHS+i);
            vHL= _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM= _mm256_load_si256(pvEM+i);
            vES= _mm256_load_si256(pvES+i);
            vEL= _mm256_load_si256(pvEL+i);
            vW = _mm256_load_si256(pvW+i);
            vWM = _mm256_load_si256(pvWM+i);
            vWS = _mm256_load_si256(pvWS+i);
            vGapper = _mm256_load_si256(pvGapper+i);
            vGapperL = _mm256_load_si256(pvGapperL+i);
            vE_opn = _mm256_subs_epi8(vH, vGapO);
            vE_ext = _mm256_subs_epi8(vE, vGapE);
            case1 = _mm256_cmpgt_epi8(vE_opn, vE_ext);
            vE = _mm256_max_epi8(vE_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vHM, case1);
            vES = _mm256_blendv_epi8(vES, vHS, case1);
            vEL = _mm256_blendv_epi8(vEL, vHL, case1);
            vEL = _mm256_adds_epi8(vEL, vOne);
            vGapper = _mm256_adds_epi8(vHt, vGapper);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi8(vF, vGapper),
                    _mm256_cmpeq_epi8(vF, vGapper));
            vF = _mm256_max_epi8(vF, vGapper);
            vFM = _mm256_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm256_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm256_blendv_epi8(
                    _mm256_adds_epi8(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm256_adds_epi8(vHp, vW);
            vHpM = _mm256_adds_epi8(vHpM, vWM);
            vHpS = _mm256_adds_epi8(vHpS, vWS);
            vHpL = _mm256_adds_epi8(vHpL, vOne);
            case1 = _mm256_cmpgt_epi8(vE, vHp);
            vHt = _mm256_max_epi8(vE, vHp);
            vHtM = _mm256_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm256_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm256_blendv_epi8(vHpL, vEL, case1);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvEM+i, vEM);
            _mm256_store_si256(pvES+i, vES);
            _mm256_store_si256(pvEL+i, vEL);
            _mm256_store_si256(pvH+i, vHp);
            _mm256_store_si256(pvHM+i, vHpM);
            _mm256_store_si256(pvHS+i, vHpS);
            _mm256_store_si256(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 1);
        vHtM = _mm256_slli_si256_rpl(vHtM, 1);
        vHtS = _mm256_slli_si256_rpl(vHtS, 1);
        vHtL = _mm256_slli_si256_rpl(vHtL, 1);
        vHt = _mm256_insert_epi8_rpl(vHt, boundary[j+1], 0);
        vGapper = _mm256_load_si256(pvGapper);
        vGapperL = _mm256_load_si256(pvGapperL);
        vGapper = _mm256_adds_epi8(vHt, vGapper);
        case1 = _mm256_or_si256(
                _mm256_cmpgt_epi8(vGapper, vF),
                _mm256_cmpeq_epi8(vGapper, vF));
        vF = _mm256_max_epi8(vF, vGapper);
        vFM = _mm256_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm256_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm256_blendv_epi8(
                vFL,
                _mm256_adds_epi8(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 1);
            __m256i vFtM = _mm256_slli_si256_rpl(vFM, 1);
            __m256i vFtS = _mm256_slli_si256_rpl(vFS, 1);
            __m256i vFtL = _mm256_slli_si256_rpl(vFL, 1);
            vFt = _mm256_adds_epi8(vFt, vSegLenXgap);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi8(vFt, vF),
                    _mm256_cmpeq_epi8(vFt, vF));
            vF = _mm256_max_epi8(vF, vFt);
            vFM = _mm256_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm256_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm256_blendv_epi8(
                    vFL,
                    _mm256_adds_epi8(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 1);
        vFM = _mm256_slli_si256_rpl(vFM, 1);
        vFS = _mm256_slli_si256_rpl(vFS, 1);
        vFL = _mm256_slli_si256_rpl(vFL, 1);
        vF = _mm256_adds_epi8(vF, vNegInfFront);
        case1 = _mm256_cmpgt_epi8(vF, vHt);
        vH = _mm256_max_epi8(vF, vHt);
        vHM = _mm256_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm256_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm256_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm256_load_si256(pvH+i);
            vHpM = _mm256_load_si256(pvHM+i);
            vHpS = _mm256_load_si256(pvHS+i);
            vHpL = _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM = _mm256_load_si256(pvEM+i);
            vES = _mm256_load_si256(pvES+i);
            vEL = _mm256_load_si256(pvEL+i);
            vF_opn = _mm256_subs_epi8(vH, vGapO);
            vF_ext = _mm256_subs_epi8(vF, vGapE);
            vF = _mm256_max_epi8(vF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi8(vF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vHM, case1);
            vFS = _mm256_blendv_epi8(vFS, vHS, case1);
            vFL = _mm256_blendv_epi8(vFL, vHL, case1);
            vFL = _mm256_adds_epi8(vFL, vOne);
            vH = _mm256_max_epi8(vHp, vE);
            vH = _mm256_max_epi8(vH, vF);
            case1 = _mm256_cmpeq_epi8(vH, vHp);
            case2 = _mm256_cmpeq_epi8(vH, vF);
            vHM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            _mm256_store_si256(pvH+i, vH);
            _mm256_store_si256(pvHM+i, vHM);
            _mm256_store_si256(pvHS+i, vHS);
            _mm256_store_si256(pvHL+i, vHL);
            vSaturationCheckMin = _mm256_min_epi8(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 
        /* extract vector containing last value from column */
        {
            __m256i cond_max;
            vH = _mm256_load_si256(pvH + offset);
            vHM = _mm256_load_si256(pvHM + offset);
            vHS = _mm256_load_si256(pvHS + offset);
            vHL = _mm256_load_si256(pvHL + offset);
            cond_max = _mm256_cmpgt_epi8(vH, vMaxH);
            vMaxH = _mm256_max_epi8(vMaxH, vH);
            vMaxM = _mm256_blendv_epi8(vMaxM, vHM, cond_max);
            vMaxS = _mm256_blendv_epi8(vMaxS, vHS, cond_max);
            vMaxL = _mm256_blendv_epi8(vMaxL, vHL, cond_max);
            if (_mm256_movemask_epi8(_mm256_and_si256(vPosMask, cond_max))) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 1);
                vHM = _mm256_slli_si256_rpl(vHM, 1);
                vHS = _mm256_slli_si256_rpl(vHS, 1);
                vHL = _mm256_slli_si256_rpl(vHL, 1);
            }
            result->stats->rowcols->score_row[j] = (int8_t) _mm256_extract_epi8_rpl (vH, 31);
            result->stats->rowcols->matches_row[j] = (int8_t) _mm256_extract_epi8_rpl (vHM, 31);
            result->stats->rowcols->similar_row[j] = (int8_t) _mm256_extract_epi8_rpl (vHS, 31);
            result->stats->rowcols->length_row[j] = (int8_t) _mm256_extract_epi8_rpl (vHL, 31);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        __m256i vHM = _mm256_load_si256(pvHM+i);
        __m256i vHS = _mm256_load_si256(pvHS+i);
        __m256i vHL = _mm256_load_si256(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm256_slli_si256_rpl(vMaxH, 1);
            vMaxM = _mm256_slli_si256_rpl(vMaxM, 1);
            vMaxS = _mm256_slli_si256_rpl(vMaxS, 1);
            vMaxL = _mm256_slli_si256_rpl(vMaxL, 1);
        }
        end_query = s1Len-1;
        score = (int8_t) _mm256_extract_epi8_rpl(vMaxH, 31);
        matches = (int8_t) _mm256_extract_epi8_rpl(vMaxM, 31);
        similar = (int8_t) _mm256_extract_epi8_rpl(vMaxS, 31);
        length = (int8_t) _mm256_extract_epi8_rpl(vMaxL, 31);
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int8_t *t = (int8_t*)pvH;
        int8_t *m = (int8_t*)pvHM;
        int8_t *s = (int8_t*)pvHS;
        int8_t *l = (int8_t*)pvHL;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
                matches = *m;
                similar = *s;
                length = *l;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
                matches = *m;
                similar = *s;
                length = *l;
            }
        }
    }

    /* extract last value from the last column */
    if (!s1_end && !s2_end)
    {
        __m256i vH = _mm256_load_si256(pvH + offset);
        __m256i vHM = _mm256_load_si256(pvHM + offset);
        __m256i vHS = _mm256_load_si256(pvHS + offset);
        __m256i vHL = _mm256_load_si256(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl(vH, 1);
            vHM = _mm256_slli_si256_rpl(vHM, 1);
            vHS = _mm256_slli_si256_rpl(vHS, 1);
            vHL = _mm256_slli_si256_rpl(vHL, 1);
        }
        end_ref = s2Len - 1;
        end_query = s1Len - 1;
        score = (int8_t) _mm256_extract_epi8_rpl (vH, 31);
        matches = (int8_t) _mm256_extract_epi8_rpl (vHM, 31);
        similar = (int8_t) _mm256_extract_epi8_rpl (vHS, 31);
        length = (int8_t) _mm256_extract_epi8_rpl (vHL, 31);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi8_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi8(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}